

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::AddLogSink(LogSink *destination)

{
  LogSink *destination_local;
  
  LogDestination::AddLogSink(destination);
  return;
}

Assistant:

void AddLogSink(LogSink* destination) {
  LogDestination::AddLogSink(destination);
}